

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

int __thiscall deqp::egl::GetConfigAttribCase::init(GetConfigAttribCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar1;
  Library *egl;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_38;
  void **local_30;
  vector<void_*,_std::allocator<void_*>_> local_28;
  GetConfigAttribCase *local_10;
  GetConfigAttribCase *this_local;
  
  local_10 = this;
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar1 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_display = pvVar1;
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  eglu::getConfigs(&local_28,egl,this->m_display);
  std::vector<void_*,_std::allocator<void_*>_>::operator=(&this->m_configs,&local_28);
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&local_28);
  local_38._M_current =
       (void **)std::vector<void_*,_std::allocator<void_*>_>::begin(&this->m_configs);
  __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
  __normal_iterator<void**>
            ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)&local_30,
             &local_38);
  (this->m_configsIter)._M_current = local_30;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void GetConfigAttribCase::init (void)
{
	DE_ASSERT(m_display == EGL_NO_DISPLAY);
	m_display		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_configs		= eglu::getConfigs(m_eglTestCtx.getLibrary(), m_display);
	m_configsIter	= m_configs.begin();

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}